

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::AsyncWrite(FabArray<amrex::FArrayBox> *mf,string *mf_name,bool valid_cells_only)

{
  undefined8 uVar1;
  bool bVar2;
  int nvar;
  BoxArray *pBVar3;
  MFInfo *info;
  byte in_DL;
  FabArrayBase *in_RDI;
  FabArray<amrex::FArrayBox> mf_tmp;
  undefined1 in_stack_00000356;
  undefined1 in_stack_00000357;
  string *in_stack_00000358;
  FabArray<amrex::FArrayBox> *in_stack_00000360;
  undefined1 in_stack_00000d23;
  How in_stack_00000d24;
  string *in_stack_00000d28;
  FabArray<amrex::FArrayBox> *in_stack_00000d30;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffde8;
  FabArray<amrex::FArrayBox> *dst;
  BoxArray *in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe02;
  undefined1 uVar4;
  undefined4 in_stack_fffffffffffffe04;
  FabFactory<amrex::FArrayBox> *factory;
  FabArray<amrex::FArrayBox> local_1e8;
  int local_40 [3];
  BATType local_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined1 local_21;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_21 = in_DL & 1;
  local_18 = in_RDI;
  bVar2 = AsyncOut::UseAsyncOut();
  if (bVar2) {
    AsyncWriteDoit(in_stack_00000360,in_stack_00000358,(bool)in_stack_00000357,
                   (bool)in_stack_00000356);
  }
  else {
    uVar4 = false;
    if ((local_21 & 1) != 0) {
      local_40 = (int  [3])FabArrayBase::nGrowVect((FabArrayBase *)local_18);
      _local_30 = local_40._0_8_;
      uVar1 = _local_30;
      local_28 = local_40[2];
      in_stack_fffffffffffffdf8 = (BoxArray *)&stack0xffffffffffffffd0;
      local_c = 0;
      local_30 = local_40[0];
      bVar2 = local_30 == null;
      in_stack_fffffffffffffe02 = true;
      uVar4 = in_stack_fffffffffffffe02;
      _local_30 = uVar1;
      local_8 = in_stack_fffffffffffffdf8;
      if (bVar2) {
        uStack_2c = local_40[1];
        bVar2 = (IndexType)uStack_2c == (IndexType)0x0;
        in_stack_fffffffffffffe02 = true;
        uVar4 = in_stack_fffffffffffffe02;
        if (bVar2) {
          in_stack_fffffffffffffe02 = local_40[2] != 0;
          uVar4 = in_stack_fffffffffffffe02;
        }
      }
    }
    if ((bool)uVar4 == false) {
      Write(in_stack_00000d30,in_stack_00000d28,in_stack_00000d24,(bool)in_stack_00000d23);
    }
    else {
      pBVar3 = FabArrayBase::boxArray((FabArrayBase *)local_18);
      info = (MFInfo *)FabArrayBase::DistributionMap((FabArrayBase *)local_18);
      nvar = FabArrayBase::nComp((FabArrayBase *)local_18);
      local_1e8.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
      local_1e8.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
      local_1e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_1e8.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
      local_1e8.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
      dst = &local_1e8;
      MFInfo::MFInfo((MFInfo *)0x12223ee);
      factory = (FabFactory<amrex::FArrayBox> *)0x0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffdc0);
      FabArray<amrex::FArrayBox>::FabArray
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffe04,
                          CONCAT13(uVar4,CONCAT12(in_stack_fffffffffffffe02,
                                                  in_stack_fffffffffffffe00))),
                 in_stack_fffffffffffffdf8,(DistributionMapping *)dst,nvar,in_stack_fffffffffffffde8
                 ,info,factory);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x1222440);
      MFInfo::~MFInfo((MFInfo *)0x122244a);
      FabArrayBase::nComp((FabArrayBase *)local_18);
      Copy<amrex::FArrayBox,void>
                (dst,(FabArray<amrex::FArrayBox> *)CONCAT44(nvar,in_stack_fffffffffffffde8),
                 (int)((ulong)info >> 0x20),(int)info,(int)((ulong)pBVar3 >> 0x20),(int)pBVar3);
      Write(in_stack_00000d30,in_stack_00000d28,in_stack_00000d24,(bool)in_stack_00000d23);
      FabArray<amrex::FArrayBox>::~FabArray(in_stack_fffffffffffffdc0);
    }
  }
  return;
}

Assistant:

void
VisMF::AsyncWrite (FabArray<FArrayBox>&& mf, const std::string& mf_name, bool valid_cells_only)
{
    if (AsyncOut::UseAsyncOut()) {
        AsyncWriteDoit(mf, mf_name, true, valid_cells_only);
    } else {
        if (valid_cells_only && mf.nGrowVect() != 0) {
            FabArray<FArrayBox> mf_tmp(mf.boxArray(), mf.DistributionMap(), mf.nComp(), 0);
            amrex::Copy(mf_tmp, mf, 0, 0, mf.nComp(), 0);
            Write(mf_tmp, mf_name);
        } else {
            Write(mf, mf_name);
        }
    }
}